

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::WhileStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQInteger SVar5;
  long lVar6;
  SQFuncState *pSVar7;
  long targetpos;
  long lVar8;
  SQScope __oldscope__;
  
  targetpos = (this->_fs->_instructions)._size - 1;
  Lex(this);
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  pSVar7 = this->_fs;
  SVar2 = (pSVar7->_unresolvedbreaks)._size;
  SVar3 = (pSVar7->_unresolvedcontinues)._size;
  __oldscope__.outers = 0;
  sqvector<long_long>::push_back(&pSVar7->_breaktargets,&__oldscope__.outers);
  __oldscope__.outers = 0;
  sqvector<long_long>::push_back(&this->_fs->_continuetargets,&__oldscope__.outers);
  pSVar7 = this->_fs;
  SVar5 = SQFuncState::PopTarget(pSVar7);
  SQFuncState::AddInstruction(pSVar7,_OP_JZ,SVar5,0,0,0);
  pSVar7 = this->_fs;
  SVar4 = (pSVar7->_instructions)._size;
  __oldscope__.outers = (this->_scope).outers;
  __oldscope__.stacksize = (this->_scope).stacksize;
  (this->_scope).outers = pSVar7->_outers;
  SVar5 = SQFuncState::GetStackSize(pSVar7);
  (this->_scope).stacksize = SVar5;
  Statement(this,true);
  lVar6 = this->_fs->_outers;
  SVar5 = SQFuncState::GetStackSize(this->_fs);
  pSVar7 = this->_fs;
  lVar8 = (this->_scope).stacksize;
  if (SVar5 != lVar8) {
    SQFuncState::SetStackSize(pSVar7,lVar8);
    pSVar7 = this->_fs;
    if (lVar6 != pSVar7->_outers) {
      SQFuncState::AddInstruction(pSVar7,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
      pSVar7 = this->_fs;
    }
  }
  (this->_scope).outers = __oldscope__.outers;
  (this->_scope).stacksize = __oldscope__.stacksize;
  SQFuncState::AddInstruction(pSVar7,_OP_JMP,0,targetpos - (pSVar7->_instructions)._size,0,0);
  SQFuncState::SetIntructionParam(this->_fs,SVar4 - 1,1,(this->_fs->_instructions)._size - SVar4);
  pSVar7 = this->_fs;
  lVar8 = (pSVar7->_unresolvedbreaks)._size - SVar2;
  lVar6 = (pSVar7->_unresolvedcontinues)._size - SVar3;
  if (0 < lVar6) {
    ResolveContinues(this,pSVar7,lVar6,targetpos);
    pSVar7 = this->_fs;
  }
  if (0 < lVar8) {
    ResolveBreaks(this,pSVar7,lVar8);
    pSVar7 = this->_fs;
  }
  pSVar1 = &(pSVar7->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar7->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  return;
}

Assistant:

void WhileStatement()
    {
        SQInteger jzpos, jmppos;
        jmppos = _fs->GetCurrentPos();
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));

        BEGIN_BREAKBLE_BLOCK();
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
        jzpos = _fs->GetCurrentPos();
        BEGIN_SCOPE();

        Statement();

        END_SCOPE();
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetIntructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);

        END_BREAKBLE_BLOCK(jmppos);
    }